

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_comparison_join.cpp
# Opt level: O2

void duckdb::PhysicalComparisonJoin::ReorderConditions
               (vector<duckdb::JoinCondition,_true> *conditions)

{
  bool bVar1;
  JoinCondition *cond;
  pointer pJVar2;
  bool bVar3;
  vector<duckdb::JoinCondition,_true> *__range1;
  vector<duckdb::JoinCondition,_true> *__range1_2;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *this;
  iterator __begin1;
  pointer pJVar4;
  pointer pJVar5;
  JoinCondition *__args;
  iterator __end1;
  vector<duckdb::JoinCondition,_true> other_conditions;
  vector<duckdb::JoinCondition,_true> equal_conditions;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_68;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_48;
  
  pJVar4 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pJVar5 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  pJVar2 = pJVar4;
  do {
    if (pJVar2 == pJVar5) {
      return;
    }
    if ((pJVar2->comparison == COMPARE_BOUNDARY_END) ||
       (bVar1 = true, pJVar2->comparison == COMPARE_BOUNDARY_START)) {
      if (bVar3) {
        local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_start = (JoinCondition *)0x0;
        local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_finish = (JoinCondition *)0x0;
        local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_start = (JoinCondition *)0x0;
        local_68.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_finish = (JoinCondition *)0x0;
        local_68.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (; pJVar4 != pJVar5; pJVar4 = pJVar4 + 1) {
          if ((pJVar4->comparison == COMPARE_BOUNDARY_END) ||
             (this = &local_68, pJVar4->comparison == COMPARE_BOUNDARY_START)) {
            this = &local_48;
          }
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>(this,pJVar4);
        }
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::clear
                  (&conditions->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>);
        pJVar4 = local_48.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pJVar5 = local_48.
                      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pJVar2 = local_68.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            __args = local_68.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_start, pJVar5 != pJVar4;
            pJVar5 = pJVar5 + 1) {
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>
                    (&conditions->
                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                     pJVar5);
        }
        for (; __args != pJVar2; __args = __args + 1) {
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>
                    (&conditions->
                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                     __args);
        }
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector
                  (&local_68);
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector
                  (&local_48);
        return;
      }
      bVar1 = false;
    }
    bVar3 = bVar1;
    pJVar2 = pJVar2 + 1;
  } while( true );
}

Assistant:

void PhysicalComparisonJoin::ReorderConditions(vector<JoinCondition> &conditions) {
	// we reorder conditions so the ones with COMPARE_EQUAL occur first
	// check if this is already the case
	bool is_ordered = true;
	bool seen_non_equal = false;
	for (auto &cond : conditions) {
		if (cond.comparison == ExpressionType::COMPARE_EQUAL ||
		    cond.comparison == ExpressionType::COMPARE_NOT_DISTINCT_FROM) {
			if (seen_non_equal) {
				is_ordered = false;
				break;
			}
		} else {
			seen_non_equal = true;
		}
	}
	if (is_ordered) {
		// no need to re-order
		return;
	}
	// gather lists of equal/other conditions
	vector<JoinCondition> equal_conditions;
	vector<JoinCondition> other_conditions;
	for (auto &cond : conditions) {
		if (cond.comparison == ExpressionType::COMPARE_EQUAL ||
		    cond.comparison == ExpressionType::COMPARE_NOT_DISTINCT_FROM) {
			equal_conditions.push_back(std::move(cond));
		} else {
			other_conditions.push_back(std::move(cond));
		}
	}
	conditions.clear();
	// reconstruct the sorted conditions
	for (auto &cond : equal_conditions) {
		conditions.push_back(std::move(cond));
	}
	for (auto &cond : other_conditions) {
		conditions.push_back(std::move(cond));
	}
}